

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Print(Mat *this,char *title)

{
  long lVar1;
  int j;
  long lVar2;
  int i;
  int iVar3;
  
  puts(title);
  for (iVar3 = 0; iVar3 < this->n_rows_; iVar3 = iVar3 + 1) {
    lVar2 = 0;
    while( true ) {
      lVar1 = (long)this->n_cols_;
      if (lVar1 + -1 <= lVar2) break;
      printf("%+5.2f ",this->v_[this->n_cols_ * iVar3 + lVar2]);
      lVar2 = lVar2 + 1;
    }
    printf("%+5.2f\n",this->v_[iVar3 * lVar1 + lVar1 + -1]);
  }
  return;
}

Assistant:

void Mat::Print(const char *title){
  printf("%s\n", title);
  for (int i=0; i<n_rows_; i++){
    for (int j=0; j<n_cols_-1; j++){
      printf("%+5.2f ", *(v_+i*n_cols_ + j));
    }
    printf("%+5.2f\n", *(v_+i*n_cols_ + n_cols_-1));
  }
}